

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

aiVector3D __thiscall Assimp::D3MF::XmlSerializer::ReadVertex(XmlSerializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar2;
  float fVar3;
  aiVector3D aVar4;
  
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  aVar4.x = ai_strtof((char *)CONCAT44(extraout_var,iVar1),(char *)0x0);
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  fVar2 = ai_strtof((char *)CONCAT44(extraout_var_00,iVar1),(char *)0x0);
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  fVar3 = ai_strtof((char *)CONCAT44(extraout_var_01,iVar1),(char *)0x0);
  aVar4.y = fVar2;
  aVar4.z = fVar3;
  return aVar4;
}

Assistant:

aiVector3D ReadVertex() {
        aiVector3D vertex;

        vertex.x = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::x.c_str()), nullptr);
        vertex.y = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::y.c_str()), nullptr);
        vertex.z = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::z.c_str()), nullptr);

        return vertex;
    }